

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readBitsFromReversedStream(size_t *bitpointer,uchar *bitstream,size_t nbits)

{
  byte bVar1;
  undefined8 local_30;
  size_t i;
  uint result;
  size_t nbits_local;
  uchar *bitstream_local;
  size_t *bitpointer_local;
  
  i._4_4_ = 0;
  for (local_30 = 0; local_30 < nbits; local_30 = local_30 + 1) {
    bVar1 = readBitFromReversedStream(bitpointer,bitstream);
    i._4_4_ = (uint)bVar1 | i._4_4_ << 1;
  }
  return i._4_4_;
}

Assistant:

static unsigned readBitsFromReversedStream(size_t* bitpointer, const unsigned char* bitstream, size_t nbits) {
  unsigned result = 0;
  size_t i;
  for(i = 0 ; i < nbits; ++i) {
    result <<= 1u;
    result |= (unsigned)readBitFromReversedStream(bitpointer, bitstream);
  }
  return result;
}